

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_allocators.cpp
# Opt level: O0

uchar * __thiscall
zmq::shared_message_memory_allocator::allocate(shared_message_memory_allocator *this)

{
  bool bVar1;
  void *pvVar2;
  long *in_RDI;
  atomic_counter_t *c_1;
  size_t allocationsize;
  atomic_counter_t *c;
  shared_message_memory_allocator *in_stack_ffffffffffffffe0;
  
  if ((*in_RDI != 0) && (bVar1 = atomic_counter_t::sub((atomic_counter_t *)*in_RDI,1), bVar1)) {
    release(in_stack_ffffffffffffffe0);
  }
  if (*in_RDI == 0) {
    pvVar2 = malloc(in_RDI[2] + 8 + in_RDI[4] * 0x28);
    *in_RDI = (long)pvVar2;
    if (*in_RDI == 0) {
      fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/decoder_allocators.cpp"
              ,0x55);
      fflush(_stderr);
      zmq_abort((char *)0x250891);
    }
    atomic_counter_t::atomic_counter_t
              ((atomic_counter_t *)in_stack_ffffffffffffffe0,(integer_t)((ulong)in_RDI >> 0x20));
  }
  else {
    atomic_counter_t::set((atomic_counter_t *)*in_RDI,(integer_t)((ulong)in_RDI >> 0x20));
  }
  in_RDI[1] = in_RDI[2];
  in_RDI[3] = *in_RDI + 8 + in_RDI[2];
  return (uchar *)(*in_RDI + 8);
}

Assistant:

unsigned char *zmq::shared_message_memory_allocator::allocate ()
{
    if (_buf) {
        // release reference count to couple lifetime to messages
        zmq::atomic_counter_t *c =
          reinterpret_cast<zmq::atomic_counter_t *> (_buf);

        // if refcnt drops to 0, there are no message using the buffer
        // because either all messages have been closed or only vsm-messages
        // were created
        if (c->sub (1)) {
            // buffer is still in use as message data. "Release" it and create a new one
            // release pointer because we are going to create a new buffer
            release ();
        }
    }

    // if buf != NULL it is not used by any message so we can re-use it for the next run
    if (!_buf) {
        // allocate memory for reference counters together with reception buffer
        std::size_t const allocationsize =
          _max_size + sizeof (zmq::atomic_counter_t)
          + _max_counters * sizeof (zmq::msg_t::content_t);

        _buf = static_cast<unsigned char *> (std::malloc (allocationsize));
        alloc_assert (_buf);

        new (_buf) atomic_counter_t (1);
    } else {
        // release reference count to couple lifetime to messages
        zmq::atomic_counter_t *c =
          reinterpret_cast<zmq::atomic_counter_t *> (_buf);
        c->set (1);
    }

    _buf_size = _max_size;
    _msg_content = reinterpret_cast<zmq::msg_t::content_t *> (
      _buf + sizeof (atomic_counter_t) + _max_size);
    return _buf + sizeof (zmq::atomic_counter_t);
}